

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

Vec2 __thiscall
tcu::computeOpenGLLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 extraout_var [12];
  
  uVar1 = -(uint)(-dudx <= dudx);
  uVar3 = -(uint)(-dvdx <= dvdx);
  uVar2 = -(uint)(-dudy <= dudy);
  uVar4 = -(uint)(-dvdy <= dvdy);
  fVar5 = (float)((uint)dudx & uVar1 | ~uVar1 & (uint)-dudx);
  fVar6 = (float)((uint)dvdx & uVar3 | ~uVar3 & (uint)-dvdx);
  fVar9 = (float)(~uVar2 & (uint)-dudy | (uint)dudy & uVar2);
  fVar8 = (float)(~uVar4 & (uint)-dvdy | (uint)dvdy & uVar4);
  uVar1 = -(uint)(fVar9 <= fVar5);
  uVar2 = -(uint)(fVar8 <= fVar6);
  fVar5 = (float)((uint)fVar5 & uVar1 | ~uVar1 & (uint)fVar9);
  fVar6 = (float)((uint)fVar6 & uVar2 | ~uVar2 & (uint)fVar8);
  uVar1 = -(uint)(-dwdx <= dwdx);
  uVar2 = -(uint)(-dwdy <= dwdy);
  fVar9 = (float)(~uVar1 & (uint)-dwdx | (uint)dwdx & uVar1);
  fVar8 = (float)(~uVar2 & (uint)-dwdy | (uint)dwdy & uVar2);
  uVar1 = -(uint)(fVar8 <= fVar9);
  fVar8 = (float)(~uVar1 & (uint)fVar8 | (uint)fVar9 & uVar1);
  fVar9 = (float)(~-(uint)(fVar6 <= fVar5) & (uint)fVar6 | -(uint)(fVar6 <= fVar5) & (uint)fVar5);
  uVar1 = -(uint)(fVar8 <= fVar9);
  fVar9 = (float)(~uVar1 & (uint)fVar8 | uVar1 & (uint)fVar9);
  fVar8 = fVar5 + fVar6 + fVar8;
  fVar5 = TexVerifierUtil::computeFloatingPointError(fVar9,prec->derivateBits);
  fVar6 = TexVerifierUtil::computeFloatingPointError(fVar8,prec->derivateBits);
  fVar5 = deFloatLog2(fVar9 - fVar5);
  fVar6 = deFloatLog2(fVar6 + fVar8);
  auVar7._0_4_ = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  auVar7._4_12_ = extraout_var;
  *(float *)this = fVar5 - auVar7._0_4_;
  *(float *)(this + 4) = fVar6 + auVar7._0_4_;
  return (Vec2)auVar7._0_8_;
}

Assistant:

Vec2 computeOpenGLLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mu			= de::max(deFloatAbs(dudx), deFloatAbs(dudy));
	const float		mv			= de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
	const float		mw			= de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));
	const float		minDBound	= de::max(de::max(mu, mv), mw);
	const float		maxDBound	= mu + mv + mw;
	const float		minDErr		= computeFloatingPointError(minDBound, prec.derivateBits);
	const float		maxDErr		= computeFloatingPointError(maxDBound, prec.derivateBits);
	const float		minLod		= deFloatLog2(minDBound-minDErr);
	const float		maxLod		= deFloatLog2(maxDBound+maxDErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}